

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_validate_keypair(picnic_privatekey_t *sk,picnic_publickey_t *pk)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  picnic_instance_t *ppVar4;
  byte *in_RSI;
  byte *in_RDI;
  uint8_t buffer [32];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t *pk_c;
  uint8_t *pk_pt;
  uint8_t *sk_c;
  uint8_t *sk_pt;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  picnic_params_t param;
  undefined1 auStackY_100 [16];
  mzd_local_t *in_stack_ffffffffffffff10;
  mzd_local_t *in_stack_ffffffffffffff18;
  lowmc_key_t *in_stack_ffffffffffffff20;
  lowmc_parameters_t *in_stack_ffffffffffffff28;
  mzd_local_t *in_stack_ffffffffffffff30;
  mzd_local_t *in_stack_ffffffffffffff38;
  
  if ((in_RDI != (byte *)0x0) && (in_RSI != (byte *)0x0)) {
    bVar1 = *in_RDI;
    ppVar4 = picnic_instance_get((uint)bVar1);
    if (ppVar4 != (picnic_instance_t *)0x0) {
      bVar2 = ppVar4->input_output_size;
      if ((((uint)bVar1 == (uint)*in_RSI) &&
          (iVar3 = memcmp(in_RDI + (int)((uint)ppVar4->input_output_size * 2 + 1),
                          in_RSI + (int)(ppVar4->input_output_size + 1),
                          (ulong)ppVar4->input_output_size), iVar3 == 0)) &&
         (iVar3 = memcmp(in_RDI + (int)(bVar2 + 1),in_RSI + 1,(ulong)ppVar4->input_output_size),
         iVar3 == 0)) {
        mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                            (size_t)in_stack_ffffffffffffff28);
        mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                            (size_t)in_stack_ffffffffffffff28);
        lowmc_compute(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                      in_stack_ffffffffffffff10);
        mzd_to_char_array((uint8_t *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
        iVar3 = memcmp(auStackY_100,in_RSI + 1,(ulong)ppVar4->input_output_size);
        return iVar3;
      }
    }
  }
  return -1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_validate_keypair(const picnic_privatekey_t* sk,
                                                      const picnic_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_params_t param       = sk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk, instance);
  const uint8_t* sk_c  = SK_C(sk, instance);
  const uint8_t* pk_pt = PK_PT(pk, instance);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (param != pk->data[0] || memcmp(sk_pt, pk_pt, instance->input_output_size) != 0 ||
      memcmp(sk_c, pk_c, instance->input_output_size) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, instance->input_output_size);
  mzd_from_char_array(privkey, sk_sk, instance->input_output_size);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, instance->input_output_size);

  return memcmp(buffer, pk_c, instance->input_output_size);
}